

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O0

ostream * absl::lts_20250127::operator<<(ostream *os,int128 v)

{
  int128 v_00;
  int128 v_01;
  int128 v_02;
  int128 lhs;
  int128 rhs;
  size_t sVar1;
  bool bVar2;
  _Ios_Fmtflags _Var3;
  fmtflags fVar4;
  int64_t iVar5;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  ostream *poVar9;
  lts_20250127 *in_RSI;
  fmtflags in_R8D;
  uint128 v_03;
  undefined8 in_stack_fffffffffffffe38;
  undefined8 in_stack_fffffffffffffe40;
  undefined8 in_stack_fffffffffffffe48;
  long lVar10;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  bool local_fd;
  int128 local_f8 [2];
  long local_d8;
  size_t count;
  streamsize width;
  uint128 local_a8;
  string local_98 [2];
  bool local_49;
  string local_48 [7];
  bool print_as_decimal;
  string rep;
  fmtflags flags;
  ostream *os_local;
  int128 v_local;
  
  rep.field_2._12_4_ = std::ios_base::flags((ios_base *)(os + *(long *)(*(long *)os + -0x18)));
  std::__cxx11::string::string(local_48);
  _Var3 = std::operator&(rep.field_2._12_4_,_S_basefield);
  local_fd = true;
  if (_Var3 != _S_dec) {
    _Var3 = std::operator&(rep.field_2._12_4_,_S_basefield);
    local_fd = _Var3 == ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max);
  }
  local_49 = local_fd;
  if (local_fd != false) {
    v_00.v_._8_8_ = in_stack_fffffffffffffe40;
    v_00.v_._0_8_ = in_stack_fffffffffffffe38;
    iVar5 = Int128High64(in_RSI,v_00);
    if (iVar5 < 0) {
      std::__cxx11::string::operator=(local_48,"-");
    }
    else {
      _Var3 = std::operator&(rep.field_2._12_4_,_S_showpos);
      if (_Var3 != ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max)) {
        std::__cxx11::string::operator=(local_48,"+");
      }
    }
  }
  if ((local_49 & 1U) == 0) {
    v_02.v_._8_8_ = in_stack_fffffffffffffe40;
    v_02.v_._0_8_ = in_stack_fffffffffffffe38;
    uint128::uint128(&local_a8,v_02);
  }
  else {
    v_01.v_._8_8_ = in_stack_fffffffffffffe40;
    v_01.v_._0_8_ = in_stack_fffffffffffffe38;
    local_a8 = anon_unknown_2::UnsignedAbsoluteValue((anon_unknown_2 *)in_RSI,v_01);
  }
  fVar4 = std::ios_base::flags((ios_base *)(os + *(long *)(*(long *)os + -0x18)));
  v_03.hi_._0_4_ = fVar4;
  v_03.lo_ = local_a8.hi_;
  v_03.hi_._4_4_ = 0;
  (anonymous_namespace)::Uint128ToFormattedString_abi_cxx11_
            (local_98,(void *)local_a8.lo_,v_03,in_R8D);
  std::__cxx11::string::append(local_48);
  std::__cxx11::string::~string((string *)local_98);
  uVar6 = std::ios_base::width((ios_base *)(os + *(long *)(*(long *)os + -0x18)),0);
  count = uVar6;
  uVar7 = std::__cxx11::string::size();
  sVar1 = count;
  if (uVar6 <= uVar7) goto LAB_00652072;
  local_d8 = std::__cxx11::string::size();
  local_d8 = sVar1 - local_d8;
  _Var3 = std::operator&(rep.field_2._12_4_,_S_adjustfield);
  lVar10 = local_d8;
  if (_Var3 != _S_internal) {
    if (_Var3 == _S_left) {
      std::ios::fill();
      std::__cxx11::string::append((ulong)local_48,(char)lVar10);
    }
    else {
      std::ios::fill();
      std::__cxx11::string::insert((ulong)local_48,0,(char)lVar10);
    }
    goto LAB_00652072;
  }
  if ((local_49 & 1U) == 0) {
LAB_00651ef5:
    _Var3 = std::operator&(rep.field_2._12_4_,_S_basefield);
    if (_Var3 == _S_hex) {
      _Var3 = std::operator&(rep.field_2._12_4_,_S_showbase);
      if (_Var3 != ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max)) {
        int128::int128(local_f8,0);
        lhs.v_._8_8_ = in_stack_fffffffffffffe40;
        lhs.v_._0_8_ = in_stack_fffffffffffffe38;
        rhs.v_._8_7_ = in_stack_fffffffffffffe50;
        rhs.v_._0_8_ = in_stack_fffffffffffffe48;
        rhs.v_._15_1_ = in_stack_fffffffffffffe57;
        bVar2 = operator!=(lhs,rhs);
        lVar10 = local_d8;
        if (bVar2) {
          std::ios::fill();
          std::__cxx11::string::insert((ulong)local_48,2,(char)lVar10);
          goto LAB_00652072;
        }
      }
    }
    lVar10 = local_d8;
    std::ios::fill();
    std::__cxx11::string::insert((ulong)local_48,0,(char)lVar10);
  }
  else {
    pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
    if (*pcVar8 != '+') {
      pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
      if (*pcVar8 != '-') goto LAB_00651ef5;
    }
    lVar10 = local_d8;
    std::ios::fill();
    std::__cxx11::string::insert((ulong)local_48,1,(char)lVar10);
  }
LAB_00652072:
  poVar9 = std::operator<<(os,local_48);
  std::__cxx11::string::~string(local_48);
  return poVar9;
}

Assistant:

std::ostream& operator<<(std::ostream& os, int128 v) {
  std::ios_base::fmtflags flags = os.flags();
  std::string rep;

  // Add the sign if needed.
  bool print_as_decimal =
      (flags & std::ios::basefield) == std::ios::dec ||
      (flags & std::ios::basefield) == std::ios_base::fmtflags();
  if (print_as_decimal) {
    if (Int128High64(v) < 0) {
      rep = "-";
    } else if (flags & std::ios::showpos) {
      rep = "+";
    }
  }

  rep.append(Uint128ToFormattedString(
      print_as_decimal ? UnsignedAbsoluteValue(v) : uint128(v), os.flags()));

  // Add the requisite padding.
  std::streamsize width = os.width(0);
  if (static_cast<size_t>(width) > rep.size()) {
    const size_t count = static_cast<size_t>(width) - rep.size();
    switch (flags & std::ios::adjustfield) {
      case std::ios::left:
        rep.append(count, os.fill());
        break;
      case std::ios::internal:
        if (print_as_decimal && (rep[0] == '+' || rep[0] == '-')) {
          rep.insert(size_t{1}, count, os.fill());
        } else if ((flags & std::ios::basefield) == std::ios::hex &&
                   (flags & std::ios::showbase) && v != 0) {
          rep.insert(size_t{2}, count, os.fill());
        } else {
          rep.insert(size_t{0}, count, os.fill());
        }
        break;
      default:  // std::ios::right
        rep.insert(size_t{0}, count, os.fill());
        break;
    }
  }

  return os << rep;
}